

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicslayoutitem.cpp
# Opt level: O1

QSizeF * __thiscall
QGraphicsLayoutItemPrivate::effectiveSizeHints(QGraphicsLayoutItemPrivate *this,QSizeF *constraint)

{
  QSizeF *maximum;
  qreal *minimum;
  qreal *preferred;
  qreal *maximum_00;
  double *pdVar1;
  QGraphicsLayoutItem *pQVar2;
  QSizeF *pQVar3;
  bool bVar4;
  bool bVar5;
  double dVar6;
  qreal qVar7;
  bool bVar8;
  long lVar9;
  QSizeF *minimum_00;
  qreal extraout_XMM0_Qa;
  qreal extraout_XMM0_Qa_00;
  qreal extraout_XMM0_Qa_01;
  double dVar10;
  
  pQVar2 = this->q_ptr;
  bVar4 = constraint->wd < 0.0;
  bVar5 = constraint->ht < 0.0;
  if (bVar5 && bVar4) {
    minimum_00 = this->cachedSizeHints;
    if ((this->field_0xb0 & 1) == 0) {
      return minimum_00;
    }
  }
  else {
    if (((this->field_0xb0 & 2) == 0) &&
       (bVar8 = qFuzzyCompare(constraint,&this->cachedConstraint), bVar8)) {
      return this->cachedSizeHintsWithConstraints;
    }
    minimum_00 = this->cachedSizeHintsWithConstraints;
  }
  lVar9 = 0;
  do {
    dVar10 = constraint->wd;
    dVar6 = constraint->ht;
    pdVar1 = (double *)((long)&minimum_00->wd + lVar9);
    *pdVar1 = dVar10;
    pdVar1[1] = dVar6;
    pQVar3 = this->userSizeHints;
    if (pQVar3 != (QSizeF *)0x0) {
      pdVar1 = (double *)((long)&minimum_00->wd + lVar9);
      if (*pdVar1 <= 0.0 && *pdVar1 != 0.0) {
        dVar10 = *(double *)((long)&pQVar3->wd + lVar9);
        *pdVar1 = dVar10;
      }
      pdVar1 = (double *)((long)&minimum_00->ht + lVar9);
      if (*pdVar1 <= 0.0 && *pdVar1 != 0.0) {
        dVar10 = *(double *)((long)&pQVar3->ht + lVar9);
        *(double *)((long)&minimum_00->ht + lVar9) = dVar10;
      }
    }
    lVar9 = lVar9 + 0x10;
  } while (lVar9 != 0x40);
  pQVar3 = minimum_00 + 1;
  maximum = minimum_00 + 2;
  normalizeHints(&minimum_00->wd,&pQVar3->wd,&maximum->wd,&minimum_00[3].wd);
  minimum = &minimum_00->ht;
  preferred = &minimum_00[1].ht;
  maximum_00 = &minimum_00[2].ht;
  normalizeHints(minimum,preferred,maximum_00,&minimum_00[3].ht);
  if ((minimum_00[2].wd <= 0.0 && minimum_00[2].wd != 0.0) ||
     (*maximum_00 <= 0.0 && *maximum_00 != 0.0)) {
    (*pQVar2->_vptr_QGraphicsLayoutItem[6])(pQVar2,2,maximum);
    if (maximum->wd <= 0.0 && maximum->wd != 0.0) {
      maximum->wd = extraout_XMM0_Qa;
    }
    if (*maximum_00 <= 0.0 && *maximum_00 != 0.0) {
      *maximum_00 = dVar10;
    }
  }
  if (maximum->wd <= 0.0 && maximum->wd != 0.0) {
    maximum->wd = 16777215.0;
  }
  if (*maximum_00 <= 0.0 && *maximum_00 != 0.0) {
    *maximum_00 = 16777215.0;
  }
  dVar10 = pQVar3->wd;
  if ((0.0 <= dVar10) && (maximum->wd <= dVar10 && dVar10 != maximum->wd)) {
    maximum->wd = dVar10;
  }
  dVar10 = *preferred;
  if ((0.0 <= dVar10) && (*maximum_00 <= dVar10 && dVar10 != *maximum_00)) {
    *maximum_00 = dVar10;
  }
  dVar10 = minimum_00->wd;
  if ((0.0 <= dVar10) && (minimum_00[2].wd <= dVar10 && dVar10 != minimum_00[2].wd)) {
    maximum->wd = dVar10;
  }
  dVar10 = *minimum;
  if ((0.0 <= dVar10) && (*maximum_00 <= dVar10 && dVar10 != *maximum_00)) {
    *maximum_00 = dVar10;
  }
  if (16777215.0 < maximum->wd) {
    maximum->wd = 16777215.0;
  }
  if (16777215.0 < *maximum_00) {
    *maximum_00 = 16777215.0;
  }
  if ((minimum_00->wd <= 0.0 && minimum_00->wd != 0.0) || (*minimum <= 0.0 && *minimum != 0.0)) {
    (*pQVar2->_vptr_QGraphicsLayoutItem[6])(pQVar2,0,minimum_00);
    if (minimum_00->wd <= 0.0 && minimum_00->wd != 0.0) {
      minimum_00->wd = extraout_XMM0_Qa_00;
    }
    if (*minimum <= 0.0 && *minimum != 0.0) {
      *minimum = dVar10;
    }
  }
  if (minimum_00->wd <= 0.0 && minimum_00->wd != 0.0) {
    minimum_00->wd = 0.0;
  }
  if (*minimum <= 0.0 && *minimum != 0.0) {
    *minimum = 0.0;
  }
  dVar10 = minimum_00[1].wd;
  if ((0.0 <= dVar10) && (dVar10 < minimum_00->wd)) {
    minimum_00->wd = dVar10;
  }
  dVar10 = *preferred;
  if ((0.0 <= dVar10) && (dVar10 < *minimum)) {
    *minimum = dVar10;
  }
  dVar10 = minimum_00[2].wd;
  if ((0.0 <= dVar10) && (dVar10 < minimum_00->wd)) {
    minimum_00->wd = dVar10;
  }
  dVar10 = *maximum_00;
  if ((0.0 <= dVar10) && (dVar10 < *minimum)) {
    *minimum = dVar10;
  }
  if ((pQVar3->wd <= 0.0 && pQVar3->wd != 0.0) || (*preferred <= 0.0 && *preferred != 0.0)) {
    (*pQVar2->_vptr_QGraphicsLayoutItem[6])(pQVar2,1,pQVar3);
    if (pQVar3->wd <= 0.0 && pQVar3->wd != 0.0) {
      pQVar3->wd = extraout_XMM0_Qa_01;
    }
    if (*preferred <= 0.0 && *preferred != 0.0) {
      *preferred = dVar10;
    }
  }
  dVar10 = minimum_00->wd;
  if ((0.0 <= dVar10) && (minimum_00[1].wd <= dVar10 && dVar10 != minimum_00[1].wd)) {
    pQVar3->wd = dVar10;
  }
  dVar10 = *minimum;
  if ((0.0 <= dVar10) && (*preferred <= dVar10 && dVar10 != *preferred)) {
    *preferred = dVar10;
  }
  dVar10 = maximum->wd;
  if ((0.0 <= dVar10) && (dVar10 < pQVar3->wd)) {
    pQVar3->wd = dVar10;
  }
  dVar10 = *maximum_00;
  if ((0.0 <= dVar10) && (dVar10 < *preferred)) {
    *preferred = dVar10;
  }
  if (bVar5 && bVar4) {
    this->field_0xb0 = this->field_0xb0 & 0xfe;
  }
  else {
    qVar7 = constraint->ht;
    (this->cachedConstraint).wd = constraint->wd;
    (this->cachedConstraint).ht = qVar7;
    this->field_0xb0 = this->field_0xb0 & 0xfd;
  }
  return minimum_00;
}

Assistant:

QSizeF *QGraphicsLayoutItemPrivate::effectiveSizeHints(const QSizeF &constraint) const
{
    Q_Q(const QGraphicsLayoutItem);
    QSizeF *sizeHintCache;
    const bool hasConstraint = constraint.width() >= 0 || constraint.height() >= 0;
    if (hasConstraint) {
        if (!sizeHintWithConstraintCacheDirty && constraint == cachedConstraint)
            return cachedSizeHintsWithConstraints;
        sizeHintCache = cachedSizeHintsWithConstraints;
    } else {
        if (!sizeHintCacheDirty)
            return cachedSizeHints;
        sizeHintCache = cachedSizeHints;
    }

    for (int i = 0; i < Qt::NSizeHints; ++i) {
        sizeHintCache[i] = constraint;
        if (userSizeHints)
            combineSize(sizeHintCache[i], userSizeHints[i]);
    }

    QSizeF &minS = sizeHintCache[Qt::MinimumSize];
    QSizeF &prefS = sizeHintCache[Qt::PreferredSize];
    QSizeF &maxS = sizeHintCache[Qt::MaximumSize];
    QSizeF &descentS = sizeHintCache[Qt::MinimumDescent];

    normalizeHints(minS.rwidth(), prefS.rwidth(), maxS.rwidth(), descentS.rwidth());
    normalizeHints(minS.rheight(), prefS.rheight(), maxS.rheight(), descentS.rheight());

    // if the minimum, preferred and maximum sizes contradict each other
    // (e.g. the minimum is larger than the maximum) we give priority to
    // the maximum size, then the minimum size and finally the preferred size
    COMBINE_SIZE(maxS, q->sizeHint(Qt::MaximumSize, maxS));
    combineSize(maxS, QSizeF(QWIDGETSIZE_MAX, QWIDGETSIZE_MAX));
    expandSize(maxS, prefS);
    expandSize(maxS, minS);
    boundSize(maxS, QSizeF(QWIDGETSIZE_MAX, QWIDGETSIZE_MAX));

    COMBINE_SIZE(minS, q->sizeHint(Qt::MinimumSize, minS));
    expandSize(minS, QSizeF(0, 0));
    boundSize(minS, prefS);
    boundSize(minS, maxS);

    COMBINE_SIZE(prefS, q->sizeHint(Qt::PreferredSize, prefS));
    expandSize(prefS, minS);
    boundSize(prefS, maxS);

    // Not supported yet
    // COMBINE_SIZE(descentS, q->sizeHint(Qt::MinimumDescent, constraint));

    if (hasConstraint) {
        cachedConstraint = constraint;
        sizeHintWithConstraintCacheDirty = false;
    } else {
        sizeHintCacheDirty = false;
    }
    return sizeHintCache;
}